

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GenerateSerializationLoop
               (Formatter *format,bool string_key,bool string_value,bool is_deterministic)

{
  char *pcVar1;
  undefined1 local_38 [8];
  string ptr;
  bool is_deterministic_local;
  bool string_value_local;
  bool string_key_local;
  Formatter *format_local;
  
  ptr.field_2._M_local_buf[0xd] = is_deterministic;
  ptr.field_2._M_local_buf[0xe] = string_value;
  ptr.field_2._M_local_buf[0xf] = string_key;
  std::__cxx11::string::string((string *)local_38);
  if ((ptr.field_2._M_local_buf[0xd] & 1U) == 0) {
    Formatter::operator()<>
              (format,
               "for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n    it = this->_internal_$name$().begin();\n    it != this->_internal_$name$().end(); ++it) {\n"
              );
    std::__cxx11::string::operator=((string *)local_38,"it");
  }
  else {
    Formatter::operator()<>(format,"for (size_type i = 0; i < n; i++) {\n");
    pcVar1 = "items[static_cast<ptrdiff_t>(i)].second";
    if ((ptr.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar1 = "items[static_cast<ptrdiff_t>(i)]";
    }
    std::__cxx11::string::operator=((string *)local_38,pcVar1);
  }
  Formatter::Indent(format);
  Formatter::operator()
            (format,
             "target = $map_classname$::Funcs::InternalSerialize($number$, $1$->first, $1$->second, target, stream);\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  if (((ptr.field_2._M_local_buf[0xf] & 1U) != 0) || ((ptr.field_2._M_local_buf[0xe] & 1U) != 0)) {
    Formatter::operator()
              (format,"Utf8Check::Check(&(*$1$));\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  Formatter::Outdent(format);
  Formatter::operator()<>(format,"}\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void GenerateSerializationLoop(const Formatter& format, bool string_key,
                                      bool string_value,
                                      bool is_deterministic) {
  std::string ptr;
  if (is_deterministic) {
    format("for (size_type i = 0; i < n; i++) {\n");
    ptr = string_key ? "items[static_cast<ptrdiff_t>(i)]"
                     : "items[static_cast<ptrdiff_t>(i)].second";
  } else {
    format(
        "for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
        "    it = this->_internal_$name$().begin();\n"
        "    it != this->_internal_$name$().end(); ++it) {\n");
    ptr = "it";
  }
  format.Indent();

  format(
      "target = $map_classname$::Funcs::InternalSerialize($number$, "
      "$1$->first, $1$->second, target, stream);\n",
      ptr);

  if (string_key || string_value) {
    // ptr is either an actual pointer or an iterator, either way we can
    // create a pointer by taking the address after de-referencing it.
    format("Utf8Check::Check(&(*$1$));\n", ptr);
  }

  format.Outdent();
  format("}\n");
}